

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O0

Position __thiscall
solitaire::colliders::TableauPileCollider::getRelativeCardPosition
          (TableauPileCollider *this,uint index,uint topCoveredCardPosition)

{
  uint local_2c;
  uint local_28;
  uint i_1;
  uint i;
  int y;
  uint topCoveredCardPosition_local;
  uint index_local;
  TableauPileCollider *this_local;
  
  i_1 = 0;
  for (local_28 = 0; local_2c = topCoveredCardPosition,
      local_28 < topCoveredCardPosition && local_28 < index; local_28 = local_28 + 1) {
    i_1 = i_1 + 3;
  }
  for (; local_2c < index; local_2c = local_2c + 1) {
    i_1 = i_1 + 0x10;
  }
  return (Position)((ulong)i_1 << 0x20);
}

Assistant:

Position TableauPileCollider::getRelativeCardPosition(
    const unsigned index, const unsigned topCoveredCardPosition) const
{
    int y = 0;
    for (unsigned i = 0; i < topCoveredCardPosition and i < index; ++i)
        y += Layout::coveredTableauPileCardsSpacing;
    for (unsigned i = topCoveredCardPosition; i < index; ++i)
        y += Layout::uncoveredTableauPileCardsSpacing;
    return Position {0, y};
}